

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O0

REF_STATUS ref_import_tetgen_node(REF_GRID *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  REF_GRID pRVar1;
  REF_NODE ref_node_00;
  REF_CELL ref_cell_00;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  FILE *pFVar5;
  ulong local_a10;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_LONG ref_private_status_reis_bi_14;
  REF_LONG ref_private_status_reis_ai_14;
  REF_LONG ref_private_status_reis_bi_13;
  REF_LONG ref_private_status_reis_ai_13;
  REF_LONG ref_private_status_reis_bi_12;
  REF_LONG ref_private_status_reis_ai_12;
  REF_LONG ref_private_status_reis_bi_11;
  REF_LONG ref_private_status_reis_ai_11;
  REF_LONG ref_private_status_reis_bi_10;
  REF_LONG ref_private_status_reis_ai_10;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reis_bi_9;
  REF_LONG ref_private_status_reis_ai_9;
  REF_LONG ref_private_status_reis_bi_8;
  REF_LONG ref_private_status_reis_ai_8;
  REF_LONG ref_private_status_reis_bi_7;
  REF_LONG ref_private_status_reis_ai_7;
  REF_LONG ref_private_status_reis_bi_6;
  REF_LONG ref_private_status_reis_ai_6;
  REF_LONG ref_private_status_reis_bi_5;
  REF_LONG ref_private_status_reis_ai_5;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  size_t end_of_string;
  REF_DBL xyz [3];
  uint local_8d8 [2];
  REF_INT nodes [27];
  uint local_864;
  uint local_860;
  REF_INT id;
  REF_INT cell;
  REF_INT new_cell;
  REF_INT ntri;
  REF_INT new_node;
  REF_INT item;
  REF_INT node;
  REF_INT mark;
  REF_INT attr;
  REF_INT ndim;
  REF_INT nnode;
  char othername [1024];
  char project [1000];
  FILE *file;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_GRID ref_grid;
  char *filename_local;
  REF_MPI ref_mpi_local;
  REF_GRID *ref_grid_ptr_local;
  
  sVar4 = strlen(filename);
  if (sVar4 < 0x400) {
    local_a10 = strlen(filename);
  }
  else {
    local_a10 = 0x3ff;
  }
  iVar2 = strncmp(filename + (local_a10 - 5),".node",5);
  if ((long)iVar2 == 0) {
    if (local_a10 < 0x400) {
      memcpy(othername + 0x3f8,filename,local_a10 - 5);
      othername[local_a10 + 0x3f3] = '\0';
      ref_grid_ptr_local._4_4_ = ref_grid_create(ref_grid_ptr,ref_mpi);
      if (ref_grid_ptr_local._4_4_ == 0) {
        pRVar1 = *ref_grid_ptr;
        ref_node_00 = pRVar1->node;
        pFVar5 = fopen(filename,"r");
        if (pFVar5 == (FILE *)0x0) {
          printf("unable to open %s\n",filename);
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
                 0x4d1,"ref_import_tetgen_node","unable to open file");
          ref_grid_ptr_local._4_4_ = 2;
        }
        else {
          iVar2 = __isoc99_fscanf(pFVar5,"%d",&attr);
          if ((long)iVar2 == 1) {
            iVar2 = __isoc99_fscanf(pFVar5,"%d",&mark);
            if ((long)iVar2 == 1) {
              if ((long)mark == 3) {
                iVar2 = __isoc99_fscanf(pFVar5,"%d",&node);
                if ((long)iVar2 == 1) {
                  if ((long)node == 0) {
                    iVar2 = __isoc99_fscanf(pFVar5,"%d",&item);
                    if ((long)iVar2 == 1) {
                      if ((long)item == 0) {
                        for (new_node = 0; new_node < attr; new_node = new_node + 1) {
                          iVar2 = __isoc99_fscanf(pFVar5,"%d",&ntri);
                          if ((long)iVar2 != 1) {
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                   ,0x4dc,"ref_import_tetgen_node","node item",1,(long)iVar2);
                            return 1;
                          }
                          if ((long)new_node != (long)ntri) {
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                   ,0x4dd,"ref_import_tetgen_node","file node index",(long)new_node,
                                   (long)ntri);
                            return 1;
                          }
                          uVar3 = ref_node_add(ref_node_00,(long)new_node,&new_cell);
                          if (uVar3 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                   ,0x4de,"ref_import_tetgen_node",(ulong)uVar3,"add node");
                            return uVar3;
                          }
                          if (new_node != new_cell) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                   ,0x4df,"ref_import_tetgen_node","node index");
                            return 1;
                          }
                          iVar2 = __isoc99_fscanf(pFVar5,"%lf",&end_of_string);
                          if (iVar2 != 1) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                   ,0x4e0,"ref_import_tetgen_node","x");
                            return 1;
                          }
                          iVar2 = __isoc99_fscanf(pFVar5,"%lf",xyz);
                          if (iVar2 != 1) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                   ,0x4e1,"ref_import_tetgen_node","y");
                            return 1;
                          }
                          iVar2 = __isoc99_fscanf(pFVar5,"%lf",xyz + 1);
                          if (iVar2 != 1) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                   ,0x4e2,"ref_import_tetgen_node","z");
                            return 1;
                          }
                          ref_node_00->real[new_cell * 0xf] = (REF_DBL)end_of_string;
                          ref_node_00->real[new_cell * 0xf + 1] = xyz[0];
                          ref_node_00->real[new_cell * 0xf + 2] = xyz[1];
                        }
                        fclose(pFVar5);
                        ref_grid_ptr_local._4_4_ =
                             ref_node_initialize_n_global(ref_node_00,(long)attr);
                        if (ref_grid_ptr_local._4_4_ == 0) {
                          snprintf((char *)&ndim,0x3fb,"%s.face",othername + 0x3f8);
                          pFVar5 = fopen((char *)&ndim,"r");
                          if (pFVar5 == (FILE *)0x0) {
                            printf("unable to open %s\n",&ndim);
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                   ,0x4ee,"ref_import_tetgen_node","unable to open file");
                            ref_grid_ptr_local._4_4_ = 2;
                          }
                          else {
                            iVar2 = __isoc99_fscanf(pFVar5,"%d",&cell);
                            if ((long)iVar2 == 1) {
                              iVar2 = __isoc99_fscanf(pFVar5,"%d",&item);
                              if ((long)iVar2 == 1) {
                                ref_cell_00 = pRVar1->cell[3];
                                for (local_860 = 0; (int)local_860 < cell; local_860 = local_860 + 1
                                    ) {
                                  iVar2 = __isoc99_fscanf(pFVar5,"%d",&ntri);
                                  if ((long)iVar2 != 1) {
                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                           ,0x4f4,"ref_import_tetgen_node","read tri item",1,
                                           (long)iVar2);
                                    return 1;
                                  }
                                  if ((long)(int)local_860 != (long)ntri) {
                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                           ,0x4f5,"ref_import_tetgen_node","tri index",
                                           (long)(int)local_860,(long)ntri);
                                    return 1;
                                  }
                                  for (new_node = 0; new_node < 3; new_node = new_node + 1) {
                                    iVar2 = __isoc99_fscanf(pFVar5,"%d",local_8d8 + new_node);
                                    if (iVar2 != 1) {
                                      printf("%s: %d: %s: %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                             ,0x4f7,"ref_import_tetgen_node","tri");
                                      return 1;
                                    }
                                  }
                                  local_864 = 0;
                                  if (item == 1) {
                                    iVar2 = __isoc99_fscanf(pFVar5,"%d",&local_864);
                                    if ((long)iVar2 != 1) {
                                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                             ,0x4f9,"ref_import_tetgen_node","tri mark id",1,
                                             (long)iVar2);
                                      return 1;
                                    }
                                  }
                                  nodes[1] = local_864;
                                  printf("cell %d: %d %d %d %d\n",(ulong)local_860,
                                         (ulong)local_8d8[0],(ulong)local_8d8[1],
                                         (ulong)(uint)nodes[0],(ulong)local_864);
                                  uVar3 = ref_cell_add(ref_cell_00,(REF_INT *)local_8d8,&id);
                                  if (uVar3 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                           ,0x4fd,"ref_import_tetgen_node",(ulong)uVar3,
                                           "tri face for tri");
                                    return uVar3;
                                  }
                                }
                                fclose(pFVar5);
                                ref_grid_ptr_local._4_4_ = 0;
                              }
                              else {
                                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                       ,0x4f0,"ref_import_tetgen_node","face header mark",1,
                                       (long)iVar2);
                                ref_grid_ptr_local._4_4_ = 1;
                              }
                            }
                            else {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                     ,0x4ef,"ref_import_tetgen_node","face header ntri",1,
                                     (long)iVar2);
                              ref_grid_ptr_local._4_4_ = 1;
                            }
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                 ,0x4e9,"ref_import_tetgen_node",(ulong)ref_grid_ptr_local._4_4_,
                                 "init glob");
                        }
                      }
                      else {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                               ,0x4d9,"ref_import_tetgen_node","nodes have mark",0,(long)item);
                        ref_grid_ptr_local._4_4_ = 1;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                             ,0x4d8,"ref_import_tetgen_node","node header mark",1,(long)iVar2);
                      ref_grid_ptr_local._4_4_ = 1;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x4d7,"ref_import_tetgen_node","nodes have attribute 3D",0,(long)node);
                    ref_grid_ptr_local._4_4_ = 1;
                  }
                }
                else {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x4d6,"ref_import_tetgen_node","node header attr",1,(long)iVar2);
                  ref_grid_ptr_local._4_4_ = 1;
                }
              }
              else {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x4d5,"ref_import_tetgen_node","not 3D",3,(long)mark);
                ref_grid_ptr_local._4_4_ = 1;
              }
            }
            else {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x4d4,"ref_import_tetgen_node","node header ndim",1,(long)iVar2);
              ref_grid_ptr_local._4_4_ = 1;
            }
          }
          else {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x4d3,"ref_import_tetgen_node","node header nnode",1,(long)iVar2);
            ref_grid_ptr_local._4_4_ = 1;
          }
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x4cb,"ref_import_tetgen_node",(ulong)ref_grid_ptr_local._4_4_,"create grid");
      }
    }
    else {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x4c7,"ref_import_tetgen_node","filename too long for temp string");
      ref_grid_ptr_local._4_4_ = 1;
    }
  }
  else {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0x4c5,
           "ref_import_tetgen_node","filename does not end in .node",0,(long)iVar2);
    ref_grid_ptr_local._4_4_ = 1;
  }
  return ref_grid_ptr_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_import_tetgen_node(REF_GRID *ref_grid_ptr,
                                                 REF_MPI ref_mpi,
                                                 const char *filename) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  FILE *file;
  char project[1000], othername[1024];
  REF_INT nnode, ndim, attr, mark, node, item, new_node;
  REF_INT ntri, new_cell, cell, id, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL xyz[3];
  size_t end_of_string;
  end_of_string = MIN(1023, strlen(filename));

  REIS(0, strncmp(&filename[end_of_string - 5], ".node", 5),
       "filename does not end in .node");

  RAS(end_of_string < 1024, "filename too long for temp string");
  memcpy(project, filename, end_of_string - 5);
  project[end_of_string - 5] = '\0';

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = (*ref_grid_ptr);
  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  REIS(1, fscanf(file, "%d", &nnode), "node header nnode");
  REIS(1, fscanf(file, "%d", &ndim), "node header ndim");
  REIS(3, ndim, "not 3D");
  REIS(1, fscanf(file, "%d", &attr), "node header attr");
  REIS(0, attr, "nodes have attribute 3D");
  REIS(1, fscanf(file, "%d", &mark), "node header mark");
  REIS(0, mark, "nodes have mark");

  for (node = 0; node < nnode; node++) {
    REIS(1, fscanf(file, "%d", &item), "node item");
    REIS(node, item, "file node index");
    RSS(ref_node_add(ref_node, node, &new_node), "add node");
    RES(node, new_node, "node index");
    RES(1, fscanf(file, "%lf", &(xyz[0])), "x");
    RES(1, fscanf(file, "%lf", &(xyz[1])), "y");
    RES(1, fscanf(file, "%lf", &(xyz[2])), "z");
    ref_node_xyz(ref_node, 0, new_node) = xyz[0];
    ref_node_xyz(ref_node, 1, new_node) = xyz[1];
    ref_node_xyz(ref_node, 2, new_node) = xyz[2];
  }
  fclose(file);

  RSS(ref_node_initialize_n_global(ref_node, nnode), "init glob");

  snprintf(othername, 1019, "%s.face", project);
  file = fopen(othername, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", othername);
  RNS(file, "unable to open file");
  REIS(1, fscanf(file, "%d", &ntri), "face header ntri");
  REIS(1, fscanf(file, "%d", &mark), "face header mark");

  ref_cell = ref_grid_tri(ref_grid);
  for (cell = 0; cell < ntri; cell++) {
    REIS(1, fscanf(file, "%d", &item), "read tri item");
    REIS(cell, item, "tri index");
    for (node = 0; node < 3; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "tri");
    id = 0;
    if (1 == mark) REIS(1, fscanf(file, "%d", &id), "tri mark id");
    nodes[3] = id;
    printf("cell %d: %d %d %d %d\n", cell, nodes[0], nodes[1], nodes[2],
           nodes[3]);
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "tri face for tri");
  }

  fclose(file);

  return REF_SUCCESS;
}